

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O3

bool __thiscall cmInstallCommandArguments::CheckPermissions(cmInstallCommandArguments *this)

{
  string *permissions;
  string *psVar1;
  bool bVar2;
  string *onePermission;
  long lVar3;
  long lVar4;
  string *psVar5;
  
  permissions = &this->PermissionsString;
  (this->PermissionsString)._M_string_length = 0;
  *(this->PermissionsString)._M_dataplus._M_p = '\0';
  onePermission =
       (this->Permissions).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->Permissions).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar1 - (long)onePermission;
  if (0 < lVar4 >> 7) {
    lVar3 = (lVar4 >> 7) + 1;
    do {
      bVar2 = CheckPermissions(onePermission,permissions);
      psVar5 = onePermission;
      if (!bVar2) goto LAB_00214846;
      bVar2 = CheckPermissions(onePermission + 1,permissions);
      psVar5 = onePermission + 1;
      if (!bVar2) goto LAB_00214846;
      bVar2 = CheckPermissions(onePermission + 2,permissions);
      psVar5 = onePermission + 2;
      if (!bVar2) goto LAB_00214846;
      bVar2 = CheckPermissions(onePermission + 3,permissions);
      psVar5 = onePermission + 3;
      if (!bVar2) goto LAB_00214846;
      onePermission = onePermission + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      psVar5 = psVar1;
      if ((lVar4 != 3) ||
         (bVar2 = CheckPermissions(onePermission,permissions), psVar5 = onePermission, !bVar2))
      goto LAB_00214846;
      onePermission = onePermission + 1;
    }
    bVar2 = CheckPermissions(onePermission,permissions);
    psVar5 = onePermission;
    if (!bVar2) goto LAB_00214846;
    onePermission = onePermission + 1;
  }
  bVar2 = CheckPermissions(onePermission,permissions);
  psVar5 = onePermission;
  if (bVar2) {
    psVar5 = psVar1;
  }
LAB_00214846:
  return psVar5 == psVar1;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions()
{
  this->PermissionsString.clear();
  return std::all_of(this->Permissions.begin(), this->Permissions.end(),
                     [this](std::string const& perm) -> bool {
                       return cmInstallCommandArguments::CheckPermissions(
                         perm, this->PermissionsString);
                     });
}